

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O3

int evutil_socket_finished_connecting_(int fd)

{
  undefined4 in_EAX;
  int iVar1;
  int *piVar2;
  int e;
  socklen_t elen;
  int local_18;
  socklen_t local_14;
  
  _local_18 = CONCAT44(4,in_EAX);
  iVar1 = getsockopt(fd,1,4,&local_18,&local_14);
  if (-1 < iVar1) {
    iVar1 = local_18;
    if (local_18 == 0) {
      return 1;
    }
    if ((local_18 == 4) || (local_18 == 0x73)) {
      return 0;
    }
    piVar2 = __errno_location();
    *piVar2 = iVar1;
  }
  return -1;
}

Assistant:

int
evutil_socket_finished_connecting_(evutil_socket_t fd)
{
	int e;
	ev_socklen_t elen = sizeof(e);

	if (getsockopt(fd, SOL_SOCKET, SO_ERROR, (void*)&e, &elen) < 0)
		return -1;

	if (e) {
		if (EVUTIL_ERR_CONNECT_RETRIABLE(e))
			return 0;
		EVUTIL_SET_SOCKET_ERROR(e);
		return -1;
	}

	return 1;
}